

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O0

int cs_impl::math_cs_ext::rand(void)

{
  numeric_float *in_RDX;
  numeric *in_RSI;
  undefined8 in_RDI;
  unkbyte10 in_ST0;
  unkbyte10 in_ST1;
  undefined8 in_stack_ffffffffffffffb2;
  undefined6 uVar1;
  undefined2 in_stack_ffffffffffffffc6;
  undefined2 uVar2;
  undefined6 uStack_36;
  longdouble local_28;
  numeric_float *local_18;
  
  uVar2 = (undefined2)in_RDI;
  uStack_36 = (undefined6)((ulong)in_RDI >> 0x10);
  local_18 = in_RDX;
  cs::numeric::as_float((numeric_float *)in_RSI,in_RSI);
  uVar1 = (undefined6)((unkuint10)in_ST0 >> 0x20);
  cs::numeric::as_float(local_18,in_RSI);
  cov::rand<long_double>
            ((longdouble)CONCAT28(uVar2,CONCAT26(in_stack_ffffffffffffffc6,uVar1)),
             (longdouble)CONCAT82(in_stack_ffffffffffffffb2,(short)((unkuint10)in_ST1 >> 0x40)));
  cs::numeric::numeric<long_double>((numeric *)CONCAT62(uStack_36,uVar2),&local_28);
  return (int)in_RDI;
}

Assistant:

numeric rand(const numeric& b, const numeric& e)
		{
			return cov::rand<numeric_float>(b.as_float(), e.as_float());
		}